

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O0

void fy_emit_write_indicator
               (fy_emitter *emit,document_indicator indicator,int flags,int indent,
               fy_emitter_write_type wtype)

{
  _Bool _Var1;
  int iVar2;
  fy_emitter_write_type wtype_local;
  int indent_local;
  int flags_local;
  document_indicator indicator_local;
  fy_emitter *emit_local;
  
  switch(indicator) {
  case di_question_mark:
    _Var1 = fy_emit_whitespace(emit);
    if (!_Var1) {
      fy_emit_write_ws(emit);
    }
    fy_emit_putc(emit,wtype,0x3f);
    emit->flags = emit->flags & 0xfffffffa;
    break;
  case di_colon:
    if ((flags & 8U) == 0) {
      if ((emit->flow_level == 0) && (_Var1 = fy_emit_is_oneline(emit), !_Var1)) {
        fy_emit_write_indent(emit,indent);
      }
      _Var1 = fy_emit_whitespace(emit);
      if (!_Var1) {
        fy_emit_write_ws(emit);
      }
    }
    fy_emit_putc(emit,wtype,0x3a);
    emit->flags = emit->flags & 0xfffffffa;
    break;
  case di_dash:
    _Var1 = fy_emit_whitespace(emit);
    if (!_Var1) {
      fy_emit_write_ws(emit);
    }
    fy_emit_putc(emit,wtype,0x2d);
    emit->flags = emit->flags & 0xfffffffa;
    break;
  case di_left_bracket:
  case di_left_brace:
    emit->flow_level = emit->flow_level + 1;
    _Var1 = fy_emit_whitespace(emit);
    if (!_Var1) {
      fy_emit_write_ws(emit);
    }
    iVar2 = 0x7b;
    if (indicator == di_left_bracket) {
      iVar2 = 0x5b;
    }
    fy_emit_putc(emit,wtype,iVar2);
    emit->flags = emit->flags | 1;
    emit->flags = emit->flags & 0xfffffff9;
    break;
  case di_right_bracket:
  case di_right_brace:
    emit->flow_level = emit->flow_level + -1;
    iVar2 = 0x7d;
    if (indicator == di_right_bracket) {
      iVar2 = 0x5d;
    }
    fy_emit_putc(emit,wtype,iVar2);
    emit->flags = emit->flags & 0xfffffff8;
    break;
  case di_comma:
    fy_emit_putc(emit,wtype,0x2c);
    emit->flags = emit->flags & 0xfffffff8;
    break;
  case di_bar:
  case di_greater:
    _Var1 = fy_emit_whitespace(emit);
    if (!_Var1) {
      fy_emit_write_ws(emit);
    }
    iVar2 = 0x3e;
    if (indicator == di_bar) {
      iVar2 = 0x7c;
    }
    fy_emit_putc(emit,wtype,iVar2);
    emit->flags = emit->flags & 0xfffffff8;
    break;
  case di_single_quote_start:
  case di_double_quote_start:
    _Var1 = fy_emit_whitespace(emit);
    if (!_Var1) {
      fy_emit_write_ws(emit);
    }
    iVar2 = 0x22;
    if (indicator == di_single_quote_start) {
      iVar2 = 0x27;
    }
    fy_emit_putc(emit,wtype,iVar2);
    emit->flags = emit->flags & 0xfffffff8;
    break;
  case di_single_quote_end:
  case di_double_quote_end:
    iVar2 = 0x22;
    if (indicator == di_single_quote_end) {
      iVar2 = 0x27;
    }
    fy_emit_putc(emit,wtype,iVar2);
    emit->flags = emit->flags & 0xfffffff8;
    break;
  case di_ambersand:
    _Var1 = fy_emit_whitespace(emit);
    if (!_Var1) {
      fy_emit_write_ws(emit);
    }
    fy_emit_putc(emit,wtype,0x26);
    emit->flags = emit->flags & 0xfffffffc;
    break;
  case di_star:
    _Var1 = fy_emit_whitespace(emit);
    if (!_Var1) {
      fy_emit_write_ws(emit);
    }
    fy_emit_putc(emit,wtype,0x2a);
    emit->flags = emit->flags & 0xfffffffc;
  }
  return;
}

Assistant:

void fy_emit_write_indicator(struct fy_emitter *emit,
                             enum document_indicator indicator,
                             int flags, int indent,
                             enum fy_emitter_write_type wtype) {
    switch (indicator) {

        case di_question_mark:
            if (!fy_emit_whitespace(emit))
                fy_emit_write_ws(emit);
            fy_emit_putc(emit, wtype, '?');
            emit->flags &= ~(FYEF_WHITESPACE | FYEF_OPEN_ENDED);
            break;

        case di_colon:
            if (!(flags & DDNF_SIMPLE)) {
                if (!emit->flow_level && !fy_emit_is_oneline(emit))
                    fy_emit_write_indent(emit, indent);
                if (!fy_emit_whitespace(emit))
                    fy_emit_write_ws(emit);
            }
            fy_emit_putc(emit, wtype, ':');
            emit->flags &= ~(FYEF_WHITESPACE | FYEF_OPEN_ENDED);
            break;

        case di_dash:
            if (!fy_emit_whitespace(emit))
                fy_emit_write_ws(emit);
            fy_emit_putc(emit, wtype, '-');
            emit->flags &= ~(FYEF_WHITESPACE | FYEF_OPEN_ENDED);
            break;

        case di_left_bracket:
        case di_left_brace:
            emit->flow_level++;
            if (!fy_emit_whitespace(emit))
                fy_emit_write_ws(emit);
            fy_emit_putc(emit, wtype, indicator == di_left_bracket ? '[' : '{');
            emit->flags |= FYEF_WHITESPACE;
            emit->flags &= ~(FYEF_INDENTATION | FYEF_OPEN_ENDED);
            break;

        case di_right_bracket:
        case di_right_brace:
            emit->flow_level--;
            fy_emit_putc(emit, wtype, indicator == di_right_bracket ? ']' : '}');
            emit->flags &= ~(FYEF_WHITESPACE | FYEF_INDENTATION | FYEF_OPEN_ENDED);
            break;

        case di_comma:
            fy_emit_putc(emit, wtype, ',');
            emit->flags &= ~(FYEF_WHITESPACE | FYEF_INDENTATION | FYEF_OPEN_ENDED);
            break;

        case di_bar:
        case di_greater:
            if (!fy_emit_whitespace(emit))
                fy_emit_write_ws(emit);
            fy_emit_putc(emit, wtype, indicator == di_bar ? '|' : '>');
            emit->flags &= ~(FYEF_INDENTATION | FYEF_WHITESPACE | FYEF_OPEN_ENDED);
            break;

        case di_single_quote_start:
        case di_double_quote_start:
            if (!fy_emit_whitespace(emit))
                fy_emit_write_ws(emit);
            fy_emit_putc(emit, wtype, indicator == di_single_quote_start ? '\'' : '"');
            emit->flags &= ~(FYEF_WHITESPACE | FYEF_INDENTATION | FYEF_OPEN_ENDED);
            break;

        case di_single_quote_end:
        case di_double_quote_end:
            fy_emit_putc(emit, wtype, indicator == di_single_quote_end ? '\'' : '"');
            emit->flags &= ~(FYEF_WHITESPACE | FYEF_INDENTATION | FYEF_OPEN_ENDED);
            break;

        case di_ambersand:
            if (!fy_emit_whitespace(emit))
                fy_emit_write_ws(emit);
            fy_emit_putc(emit, wtype, '&');
            emit->flags &= ~(FYEF_WHITESPACE | FYEF_INDENTATION);
            break;

        case di_star:
            if (!fy_emit_whitespace(emit))
                fy_emit_write_ws(emit);
            fy_emit_putc(emit, wtype, '*');
            emit->flags &= ~(FYEF_WHITESPACE | FYEF_INDENTATION);
            break;
    }
}